

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

Expr * substExpr(SubstContext *pSubst,Expr *pExpr)

{
  byte *pbVar1;
  u8 uVar2;
  sqlite3 *db;
  bool bVar3;
  Expr *pEVar4;
  u8 uVar5;
  Select *pSVar6;
  Expr *p;
  Select **ppSVar7;
  long lVar8;
  Expr ifNullRow;
  Expr local_78;
  
  if (pExpr == (Expr *)0x0) {
    return (Expr *)0x0;
  }
  if (((pExpr->flags & 1) != 0) && (pSubst->iTable == (int)pExpr->iRightJoinTable)) {
    pExpr->iRightJoinTable = (i16)pSubst->iNewTable;
  }
  if (pExpr->op == 0xa0) {
    if (pExpr->iTable == pSubst->iTable) {
      pExpr->iTable = pSubst->iNewTable;
    }
LAB_002448c7:
    pEVar4 = substExpr(pSubst,pExpr->pLeft);
    pExpr->pLeft = pEVar4;
    pEVar4 = substExpr(pSubst,pExpr->pRight);
    pExpr->pRight = pEVar4;
    pSVar6 = (Select *)(pExpr->x).pList;
    if ((pExpr->flags & 0x800) == 0) {
      if ((pSVar6 != (Select *)0x0) && (0 < *(int *)&pSVar6->pEList)) {
        ppSVar7 = (Select **)&pSVar6->op;
        lVar8 = 0;
        do {
          pEVar4 = substExpr(pSubst,(Expr *)*ppSVar7);
          *ppSVar7 = (Select *)pEVar4;
          lVar8 = lVar8 + 1;
          ppSVar7 = ppSVar7 + 4;
        } while (lVar8 < *(int *)&pSVar6->pEList);
      }
    }
    else {
      substSelect(pSubst,pSVar6,1);
    }
    return pExpr;
  }
  if ((pExpr->op != 0x98) || (pExpr->iTable != pSubst->iTable)) goto LAB_002448c7;
  if ((long)pExpr->iColumn < 0) {
    pExpr->op = 'e';
    return pExpr;
  }
  pEVar4 = pSubst->pEList->a[pExpr->iColumn].pExpr;
  uVar2 = pEVar4->op;
  uVar5 = uVar2;
  if (uVar2 == 0x9d) {
    uVar5 = pEVar4->op2;
  }
  if (uVar5 == 'w') {
    pSVar6 = (pEVar4->x).pSelect;
  }
  else {
    bVar3 = true;
    if (uVar5 != 0x9e) goto LAB_00244957;
    pSVar6 = (Select *)&pEVar4->x;
  }
  bVar3 = ((anon_union_8_2_a01b6dbf_for_x *)&pSVar6->pEList)->pList->nExpr < 2;
LAB_00244957:
  if (bVar3) {
    db = pSubst->pParse->db;
    p = pEVar4;
    if ((uVar2 != 0x98) && (pSubst->isLeftJoin != 0)) {
      local_78.u.zToken = (char *)0x0;
      local_78.pRight = (Expr *)0x0;
      local_78.iColumn = 0;
      local_78.iAgg = 0;
      local_78.iRightJoinTable = 0;
      local_78.op2 = '\0';
      local_78._55_1_ = 0;
      local_78.pAggInfo = (AggInfo *)0x0;
      local_78.x.pList = (ExprList *)0x0;
      local_78.pTab = (Table *)0x0;
      local_78.op = 0xa0;
      local_78.affinity = '\0';
      local_78._2_2_ = 0;
      local_78.flags = 0;
      local_78._40_8_ = (ulong)(uint)pSubst->iNewTable << 0x20;
      p = &local_78;
      local_78.pLeft = pEVar4;
    }
    pEVar4 = exprDup(db,p,0,(u8 **)0x0);
    if (pEVar4 != (Expr *)0x0) {
      if (pSubst->isLeftJoin != 0) {
        pbVar1 = (byte *)((long)&pEVar4->flags + 2);
        *pbVar1 = *pbVar1 | 0x10;
      }
      if ((pExpr->flags & 1) != 0) {
        pEVar4->iRightJoinTable = pExpr->iRightJoinTable;
        *(byte *)&pEVar4->flags = (byte)pEVar4->flags | 1;
      }
    }
    sqlite3ExprDeleteNN(db,pExpr);
    return pEVar4;
  }
  sqlite3VectorErrorMsg(pSubst->pParse,pEVar4);
  return pExpr;
}

Assistant:

static Expr *substExpr(
  SubstContext *pSubst,  /* Description of the substitution */
  Expr *pExpr            /* Expr in which substitution occurs */
){
  if( pExpr==0 ) return 0;
  if( ExprHasProperty(pExpr, EP_FromJoin) && pExpr->iRightJoinTable==pSubst->iTable ){
    pExpr->iRightJoinTable = pSubst->iNewTable;
  }
  if( pExpr->op==TK_COLUMN && pExpr->iTable==pSubst->iTable ){
    if( pExpr->iColumn<0 ){
      pExpr->op = TK_NULL;
    }else{
      Expr *pNew;
      Expr *pCopy = pSubst->pEList->a[pExpr->iColumn].pExpr;
      Expr ifNullRow;
      assert( pSubst->pEList!=0 && pExpr->iColumn<pSubst->pEList->nExpr );
      assert( pExpr->pLeft==0 && pExpr->pRight==0 );
      if( sqlite3ExprIsVector(pCopy) ){
        sqlite3VectorErrorMsg(pSubst->pParse, pCopy);
      }else{
        sqlite3 *db = pSubst->pParse->db;
        if( pSubst->isLeftJoin && pCopy->op!=TK_COLUMN ){
          memset(&ifNullRow, 0, sizeof(ifNullRow));
          ifNullRow.op = TK_IF_NULL_ROW;
          ifNullRow.pLeft = pCopy;
          ifNullRow.iTable = pSubst->iNewTable;
          pCopy = &ifNullRow;
        }
        pNew = sqlite3ExprDup(db, pCopy, 0);
        if( pNew && pSubst->isLeftJoin ){
          ExprSetProperty(pNew, EP_CanBeNull);
        }
        if( pNew && ExprHasProperty(pExpr,EP_FromJoin) ){
          pNew->iRightJoinTable = pExpr->iRightJoinTable;
          ExprSetProperty(pNew, EP_FromJoin);
        }
        sqlite3ExprDelete(db, pExpr);
        pExpr = pNew;
      }
    }
  }else{
    if( pExpr->op==TK_IF_NULL_ROW && pExpr->iTable==pSubst->iTable ){
      pExpr->iTable = pSubst->iNewTable;
    }
    pExpr->pLeft = substExpr(pSubst, pExpr->pLeft);
    pExpr->pRight = substExpr(pSubst, pExpr->pRight);
    if( ExprHasProperty(pExpr, EP_xIsSelect) ){
      substSelect(pSubst, pExpr->x.pSelect, 1);
    }else{
      substExprList(pSubst, pExpr->x.pList);
    }
  }
  return pExpr;
}